

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O0

void MULTICLASS::finish_example(vw *all,example *ec,bool update_loss)

{
  code *pcVar1;
  char *pcVar2;
  int iVar3;
  int **ppiVar4;
  ulong uVar5;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  substring ss_pred;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  float loss;
  example *in_stack_fffffffffffffed8;
  vw *in_stack_fffffffffffffee0;
  bool local_c9;
  allocator local_89;
  string local_88 [32];
  substring local_68;
  example *local_58;
  vw *local_50;
  undefined8 local_48;
  undefined8 local_40;
  int local_34;
  int *local_30;
  int *local_28;
  v_array<int> *local_20;
  float local_18;
  byte local_11;
  long local_10;
  long *local_8;
  
  local_11 = in_DL & 1;
  local_18 = 0.0;
  if ((*(int *)(in_RSI + 0x6828) != *(int *)(in_RSI + 0x6850)) && (*(int *)(in_RSI + 0x6828) != -1))
  {
    local_18 = *(float *)(in_RSI + 0x6870);
  }
  local_c9 = false;
  if (local_11 != 0) {
    local_c9 = *(int *)(in_RSI + 0x6828) != -1;
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  shared_data::update((shared_data *)*in_RDI,(bool)(*(byte *)(in_RSI + 0x68c8) & 1),local_c9,
                      local_18,*(float *)(in_RSI + 0x6870),*(size_t *)(in_RSI + 0x68a0));
  local_20 = (v_array<int> *)(local_8 + 0x6a2);
  ppiVar4 = v_array<int>::begin(local_20);
  local_28 = *ppiVar4;
  ppiVar4 = v_array<int>::end(local_20);
  local_30 = *ppiVar4;
  for (; local_28 != local_30; local_28 = local_28 + 1) {
    local_34 = *local_28;
    if (*(long *)(*local_8 + 0x70) == 0) {
      in_stack_fffffffffffffed8 = *(example **)(local_10 + 0x6878);
      in_stack_fffffffffffffee0 = *(vw **)(local_10 + 0x6880);
      local_48 = *(undefined8 *)(local_10 + 0x6888);
      local_40 = *(undefined8 *)(local_10 + 0x6890);
      local_58 = in_stack_fffffffffffffed8;
      local_50 = in_stack_fffffffffffffee0;
      (*(code *)local_8[0x6a7])((float)*(uint *)(local_10 + 0x6850),0,local_34);
    }
    else {
      local_68 = namedlabels::get((namedlabels *)in_stack_fffffffffffffee0,
                                  (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      iVar3 = local_34;
      pcVar1 = (code *)local_8[0x6a8];
      pcVar2 = local_68.begin;
      uVar5 = (long)local_68.end - (long)local_68.begin;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,pcVar2,uVar5,&local_89);
      in_stack_fffffffffffffed8 = *(example **)(local_10 + 0x6878);
      in_stack_fffffffffffffee0 = *(vw **)(local_10 + 0x6880);
      (*pcVar1)(iVar3,local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
    }
  }
  print_update<&MULTICLASS::direct_print_update>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,0);
  VW::finish_example(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  return;
}

Assistant:

void finish_example(vw& all, example& ec, bool update_loss)
{
  float loss = 0;
  if (ec.l.multi.label != (uint32_t)ec.pred.multiclass && ec.l.multi.label != (uint32_t)-1)
    loss = ec.weight;

  all.sd->update(ec.test_only, update_loss && (ec.l.multi.label != (uint32_t)-1), loss, ec.weight, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (!all.sd->ldict)
      all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);
    else
    {
      substring ss_pred = all.sd->ldict->get(ec.pred.multiclass);
      all.print_text(sink, string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.tag);
    }

  MULTICLASS::print_update<direct_print_update>(all, ec, ec.pred.multiclass);
  VW::finish_example(all, ec);
}